

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_corr_to_refl_coef.c
# Opt level: O0

void WebRtcSpl_AutoCorrToReflCoef(int32_t *R,int use_order,int16_t *K)

{
  int16_t iVar1;
  int iVar2;
  short local_cc;
  int16_t local_c6 [3];
  int16_t W [14];
  int16_t P [14];
  int16_t ACF [14];
  int16_t *w1ptr;
  int16_t *p1ptr;
  int16_t *wptr;
  int16_t *pptr;
  int16_t *acfptr;
  int32_t L_den;
  int32_t L_num;
  int32_t *rptr;
  int local_28;
  int iStack_24;
  int16_t tmp;
  int n;
  int i;
  int16_t *K_local;
  int use_order_local;
  int32_t *R_local;
  
  iVar1 = WebRtcSpl_NormW32(*R);
  W[0xc] = (int16_t)((uint)(*R << ((byte)iVar1 & 0x1f)) >> 0x10);
  p1ptr = local_c6;
  wptr = W + 0xd;
  pptr = P + 0xd;
  _L_den = R + 1;
  P[0xc] = W[0xc];
  for (iStack_24 = 1; iStack_24 <= use_order; iStack_24 = iStack_24 + 1) {
    *pptr = (int16_t)((uint)(*_L_den << ((byte)iVar1 & 0x1f)) >> 0x10);
    *p1ptr = *pptr;
    *wptr = *pptr;
    p1ptr = p1ptr + 1;
    wptr = wptr + 1;
    pptr = pptr + 1;
    _L_den = _L_den + 1;
  }
  local_28 = 1;
  _n = K;
  while( true ) {
    if (use_order < local_28) {
      return;
    }
    if (W[0xd] < 0) {
      local_cc = -W[0xd];
    }
    else {
      local_cc = W[0xd];
    }
    if (W[0xc] < local_cc) break;
    *_n = 0;
    if (local_cc != 0) {
      acfptr._4_4_ = (int)local_cc;
      iStack_24 = 0xf;
      while (iVar2 = iStack_24 + -1, iStack_24 != 0) {
        *_n = *_n << 1;
        acfptr._4_4_ = acfptr._4_4_ * 2;
        iStack_24 = iVar2;
        if (W[0xc] <= acfptr._4_4_) {
          acfptr._4_4_ = acfptr._4_4_ - W[0xc];
          *_n = *_n + 1;
        }
      }
      if (0 < W[0xd]) {
        *_n = -*_n;
      }
    }
    if (local_28 == use_order) {
      return;
    }
    W[0xc] = WebRtcSpl_AddSatW16(W[0xc],(int16_t)((int)W[0xd] * (int)*_n + 0x4000 >> 0xf));
    wptr = W + 0xd;
    p1ptr = local_c6;
    for (iStack_24 = 1; iStack_24 <= use_order - local_28; iStack_24 = iStack_24 + 1) {
      iVar1 = WebRtcSpl_AddSatW16(wptr[1],(int16_t)((int)*p1ptr * (int)*_n + 0x4000 >> 0xf));
      *wptr = iVar1;
      wptr = wptr + 1;
      iVar1 = WebRtcSpl_AddSatW16(*p1ptr,(int16_t)((int)*wptr * (int)*_n + 0x4000 >> 0xf));
      *p1ptr = iVar1;
      p1ptr = p1ptr + 1;
    }
    local_28 = local_28 + 1;
    _n = _n + 1;
  }
  for (iStack_24 = local_28; iStack_24 <= use_order; iStack_24 = iStack_24 + 1) {
    *_n = 0;
    _n = _n + 1;
  }
  return;
}

Assistant:

void WebRtcSpl_AutoCorrToReflCoef(const int32_t *R, int use_order, int16_t *K)
{
    int i, n;
    int16_t tmp;
    const int32_t *rptr;
    int32_t L_num, L_den;
    int16_t *acfptr, *pptr, *wptr, *p1ptr, *w1ptr, ACF[WEBRTC_SPL_MAX_LPC_ORDER],
            P[WEBRTC_SPL_MAX_LPC_ORDER], W[WEBRTC_SPL_MAX_LPC_ORDER];

    // Initialize loop and pointers.
    acfptr = ACF;
    rptr = R;
    pptr = P;
    p1ptr = &P[1];
    w1ptr = &W[1];
    wptr = w1ptr;

    // First loop; n=0. Determine shifting.
    tmp = WebRtcSpl_NormW32(*R);
    *acfptr = (int16_t)((*rptr++ << tmp) >> 16);
    *pptr++ = *acfptr++;

    // Initialize ACF, P and W.
    for (i = 1; i <= use_order; i++)
    {
        *acfptr = (int16_t)((*rptr++ << tmp) >> 16);
        *wptr++ = *acfptr;
        *pptr++ = *acfptr++;
    }

    // Compute reflection coefficients.
    for (n = 1; n <= use_order; n++, K++)
    {
        tmp = WEBRTC_SPL_ABS_W16(*p1ptr);
        if (*P < tmp)
        {
            for (i = n; i <= use_order; i++)
                *K++ = 0;

            return;
        }

        // Division: WebRtcSpl_div(tmp, *P)
        *K = 0;
        if (tmp != 0)
        {
            L_num = tmp;
            L_den = *P;
            i = 15;
            while (i--)
            {
                (*K) <<= 1;
                L_num <<= 1;
                if (L_num >= L_den)
                {
                    L_num -= L_den;
                    (*K)++;
                }
            }
            if (*p1ptr > 0)
                *K = -*K;
        }

        // Last iteration; don't do Schur recursion.
        if (n == use_order)
            return;

        // Schur recursion.
        pptr = P;
        wptr = w1ptr;
        tmp = (int16_t)(((int32_t)*p1ptr * (int32_t)*K + 16384) >> 15);
        *pptr = WebRtcSpl_AddSatW16(*pptr, tmp);
        pptr++;
        for (i = 1; i <= use_order - n; i++)
        {
            tmp = (int16_t)(((int32_t)*wptr * (int32_t)*K + 16384) >> 15);
            *pptr = WebRtcSpl_AddSatW16(*(pptr + 1), tmp);
            pptr++;
            tmp = (int16_t)(((int32_t)*pptr * (int32_t)*K + 16384) >> 15);
            *wptr = WebRtcSpl_AddSatW16(*wptr, tmp);
            wptr++;
        }
    }
}